

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_add_8_er_pi7(void)

{
  uint uVar1;
  uint *puVar2;
  uint res;
  uint dst;
  uint src;
  uint *r_dst;
  
  puVar2 = m68ki_cpu.dar + (m68ki_cpu.ir >> 9 & 7);
  uVar1 = OPER_A7_PI_8();
  m68ki_cpu.x_flag = uVar1 + (*puVar2 & 0xff);
  m68ki_cpu.v_flag = (uVar1 ^ m68ki_cpu.x_flag) & (*puVar2 & 0xff ^ m68ki_cpu.x_flag);
  m68ki_cpu.not_z_flag = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *puVar2 = *puVar2 & 0xffffff00 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_add_8_er_pi7(void)
{
	uint* r_dst = &DX;
	uint src = OPER_A7_PI_8();
	uint dst = MASK_OUT_ABOVE_8(*r_dst);
	uint res = src + dst;

	FLAG_N = NFLAG_8(res);
	FLAG_V = VFLAG_ADD_8(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | FLAG_Z;
}